

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int BUFFER_build(BUFFER_HANDLE handle,uchar *source,size_t size)

{
  uchar *puVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  uchar *newBuffer;
  BUFFER *b_1;
  BUFFER *b;
  int result;
  size_t size_local;
  uchar *source_local;
  BUFFER_HANDLE handle_local;
  
  if (handle == (BUFFER_HANDLE)0x0) {
    b._4_4_ = 0x9a;
  }
  else if (size == 0) {
    free(handle->buffer);
    handle->buffer = (uchar *)0x0;
    handle->size = 0;
    b._4_4_ = 0;
  }
  else if (source == (uchar *)0x0) {
    b._4_4_ = 0xac;
  }
  else {
    puVar1 = (uchar *)realloc(handle->buffer,size);
    if (puVar1 == (uchar *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/buffer.c"
                  ,"BUFFER_build",0xb6,1,"Failure reallocating buffer");
      }
      b._4_4_ = 0xb7;
    }
    else {
      handle->buffer = puVar1;
      handle->size = size;
      memcpy(handle->buffer,source,size);
      b._4_4_ = 0;
    }
  }
  return b._4_4_;
}

Assistant:

int BUFFER_build(BUFFER_HANDLE handle, const unsigned char* source, size_t size)
{
    int result;
    if (handle == NULL)
    {
        /* Codes_SRS_BUFFER_07_009: [BUFFER_build shall return nonzero if handle is NULL ] */
        result = MU_FAILURE;
    }
    /* Codes_SRS_BUFFER_01_002: [The size argument can be zero, in which case the underlying buffer held by the buffer instance shall be freed.] */
    else if (size == 0)
    {
        /* Codes_SRS_BUFFER_01_003: [If size is zero, source can be NULL.] */
        BUFFER* b = (BUFFER*)handle;
        free(b->buffer);
        b->buffer = NULL;
        b->size = 0;

        result = 0;
    }
    else
    {
        if (source == NULL)
        {
            /* Codes_SRS_BUFFER_01_001: [If size is positive and source is NULL, BUFFER_build shall return nonzero] */
            result = MU_FAILURE;
        }
        else
        {
            BUFFER* b = (BUFFER*)handle;
            /* Codes_SRS_BUFFER_07_011: [BUFFER_build shall overwrite previous contents if the buffer has been previously allocated.] */
            unsigned char* newBuffer = (unsigned char*)realloc(b->buffer, size);
            if (newBuffer == NULL)
            {
                /* Codes_SRS_BUFFER_07_010: [BUFFER_build shall return nonzero if any error is encountered.] */
                LogError("Failure reallocating buffer");
                result = MU_FAILURE;
            }
            else
            {
                b->buffer = newBuffer;
                b->size = size;
                /* Codes_SRS_BUFFER_01_002: [The size argument can be zero, in which case nothing shall be copied from source.] */
                (void)memcpy(b->buffer, source, size);

                result = 0;
            }
        }
    }

    return result;
}